

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_hook.h
# Opt level: O2

void __thiscall
absl::lts_20250127::base_internal::
AtomicHook<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(std::basic_string_view<char,_std::char_traits<char>_>,_const_absl::lts_20250127::Cord_&)>
::Store(AtomicHook<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(std::basic_string_view<char,_std::char_traits<char>_>,_const_absl::lts_20250127::Cord_&)>
        *this,FnPtr fn)

{
  bool bVar1;
  
  bVar1 = DoStore(this,fn);
  if (bVar1) {
    return;
  }
  __assert_fail("success",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/base/internal/atomic_hook.h"
                ,0x6e,
                "void absl::base_internal::AtomicHook<std::optional<std::basic_string<char>> (*)(std::basic_string_view<char>, const absl::Cord &)>::Store(FnPtr) [T = std::optional<std::basic_string<char>> (*)(std::basic_string_view<char>, const absl::Cord &)]"
               );
}

Assistant:

void Store(FnPtr fn) {
    bool success = DoStore(fn);
    static_cast<void>(success);
    assert(success);
  }